

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::CopyPageContentToTargetPageRecoded
          (PDFDocumentHandler *this,PDFPage *inPage,PDFDictionary *inPageObject)

{
  PDFParser *this_00;
  bool bVar1;
  EPDFObjectType EVar2;
  EStatusCode EVar3;
  PageContentContext *inContentContext;
  PDFIndirectObjectReference *inValue;
  PDFObject *inOriginal;
  PDFStreamInput *inContentSource;
  Trace *pTVar4;
  char *pcVar5;
  RefCountPtr<PDFObject> pageContent;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PDFObjectCastPtr<PDFStreamInput> contentStream;
  PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
  RefCountPtr<PDFObject> local_80;
  string local_70;
  RefCountPtr<PDFStreamInput> local_50;
  RefCountPtr<PDFIndirectObjectReference> local_40;
  
  this_00 = this->mParser;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Contents","");
  local_80.mValue = PDFParser::QueryDictionaryObject(this_00,inPageObject,&local_70);
  local_80._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
  if ((PDFArray *)local_80.mValue == (PDFArray *)0x0) {
    EVar3 = eSuccess;
  }
  else {
    inContentContext =
         PDFHummus::DocumentContext::StartPageContentContext(this->mDocumentContext,inPage);
    EVar2 = PDFObject::GetType(local_80.mValue);
    if (EVar2 == ePDFObjectStream) {
      EVar3 = WritePDFStreamInputToContentContext
                        (this,inContentContext,(PDFStreamInput *)local_80.mValue);
    }
    else {
      EVar2 = PDFObject::GetType(local_80.mValue);
      if (EVar2 == ePDFObjectArray) {
        PDFArray::GetIterator((PDFArray *)local_80.mValue);
        local_40.mValue = (PDFIndirectObjectReference *)0x0;
        local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9a10;
        EVar3 = eSuccess;
        do {
          if ((pointer)local_70.field_2._M_allocated_capacity == local_70._M_dataplus._M_p) {
LAB_001cae8a:
            bVar1 = false;
          }
          else {
            if ((char)local_70._M_string_length == '\x01') {
              local_70._M_string_length._0_1_ = '\0';
            }
            else {
              local_70.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity + 8;
              if ((pointer)local_70.field_2._M_allocated_capacity == local_70._M_dataplus._M_p)
              goto LAB_001cae8a;
            }
            bVar1 = true;
          }
          if ((EVar3 != eSuccess) || (!bVar1)) break;
          inValue = PDFObjectCast<PDFIndirectObjectReference>
                              (*(PDFObject **)local_70.field_2._M_allocated_capacity);
          RefCountPtr<PDFIndirectObjectReference>::operator=(&local_40,inValue);
          if (local_40.mValue == (PDFIndirectObjectReference *)0x0) {
            pTVar4 = Trace::DefaultTrace();
            EVar3 = eFailure;
            Trace::TraceToLog(pTVar4,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs"
                             );
            break;
          }
          inOriginal = PDFParser::ParseNewObject(this->mParser,(local_40.mValue)->mObjectID);
          inContentSource = PDFObjectCast<PDFStreamInput>(inOriginal);
          local_50._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9820;
          local_50.mValue = inContentSource;
          if (inContentSource == (PDFStreamInput *)0x0) {
            pTVar4 = Trace::DefaultTrace();
            EVar3 = eFailure;
            Trace::TraceToLog(pTVar4,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams"
                             );
          }
          else {
            EVar3 = WritePDFStreamInputToContentContext(this,inContentContext,inContentSource);
          }
          RefCountPtr<PDFStreamInput>::~RefCountPtr(&local_50);
        } while (inContentSource != (PDFStreamInput *)0x0);
        RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_40);
      }
      else {
        pTVar4 = Trace::DefaultTrace();
        EVar2 = PDFObject::GetType(local_80.mValue);
        pcVar5 = PDFObject::scPDFObjectTypeLabel(EVar2);
        EVar3 = eFailure;
        Trace::TraceToLog(pTVar4,
                          "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s"
                          ,pcVar5);
      }
    }
    if (EVar3 == eSuccess) {
      PDFHummus::DocumentContext::EndPageContentContext(this->mDocumentContext,inContentContext);
    }
    else if (inContentContext != (PageContentContext *)0x0) {
      (*(inContentContext->super_AbstractContentContext)._vptr_AbstractContentContext[1])
                (inContentContext);
    }
  }
  RefCountPtr<PDFObject>::~RefCountPtr(&local_80);
  return EVar3;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyPageContentToTargetPageRecoded(PDFPage* inPage,PDFDictionary* inPageObject)
{
	EStatusCode status = PDFHummus::eSuccess;
    
	RefCountPtr<PDFObject> pageContent(mParser->QueryDictionaryObject(inPageObject,"Contents"));
    
    // for empty page, do nothing
    if(!pageContent)
        return status;
    
	PageContentContext* pageContentContext = mDocumentContext->StartPageContentContext(inPage);
	if(pageContent->GetType() == PDFObject::ePDFObjectStream)
	{
		status = WritePDFStreamInputToContentContext(pageContentContext,(PDFStreamInput*)pageContent.GetPtr());
	}
	else if(pageContent->GetType() == PDFObject::ePDFObjectArray)
	{
		SingleValueContainerIterator<PDFObjectVector> it = ((PDFArray*)pageContent.GetPtr())->GetIterator();
		PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
		while(it.MoveNext() && status == PDFHummus::eSuccess)
		{
			refItem = it.GetItem();
			if(!refItem)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs");
				break;
			}
			PDFObjectCastPtr<PDFStreamInput> contentStream(mParser->ParseNewObject(refItem->mObjectID));
			if(!contentStream)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams");
				break;
			}
			status = WritePDFStreamInputToContentContext(pageContentContext,contentStream.GetPtr());
		}
	}
	else
	{
		TRACE_LOG1("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s",PDFObject::scPDFObjectTypeLabel(pageContent->GetType()));
		status = PDFHummus::eFailure;
	}
	
	if(status != PDFHummus::eSuccess)
	{
		delete pageContentContext;
	}
	else
	{
		mDocumentContext->EndPageContentContext(pageContentContext);
	}
	return status;
}